

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

StructDef * __thiscall
flatbuffers::Parser::LookupCreateStruct
          (Parser *this,string *name,bool create_if_new,bool definition)

{
  SymbolTable<flatbuffers::EnumDef> *pSVar1;
  Parser *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined4 local_60;
  Parser *local_50;
  StructDef *struct_def;
  string qualified_name;
  bool definition_local;
  bool create_if_new_local;
  string *name_local;
  Parser *this_local;
  
  qualified_name.field_2._M_local_buf[0xe] = definition;
  qualified_name.field_2._M_local_buf[0xf] = create_if_new;
  Namespace::GetFullyQualifiedName((string *)&struct_def,this->current_namespace_,name,1000);
  local_50 = (Parser *)LookupStruct(this,name);
  if ((local_50 == (Parser *)0x0) ||
     ((*(byte *)((long)&(local_50->enums_).dict._M_t._M_impl.super__Rb_tree_header._M_header.
                        _M_right + 1) & 1) == 0)) {
    local_50 = (Parser *)LookupStruct(this,(string *)&struct_def);
    if ((local_50 == (Parser *)0x0) ||
       ((*(byte *)((long)&(local_50->enums_).dict._M_t._M_impl.super__Rb_tree_header._M_header.
                          _M_right + 1) & 1) == 0)) {
      if (((qualified_name.field_2._M_local_buf[0xe] & 1U) == 0) && (local_50 == (Parser *)0x0)) {
        local_50 = (Parser *)LookupStructThruParentNamespaces(this,name);
      }
      if ((local_50 == (Parser *)0x0) && ((qualified_name.field_2._M_local_buf[0xf] & 1U) != 0)) {
        this_00 = (Parser *)operator_new(0x148);
        StructDef::StructDef((StructDef *)this_00);
        local_50 = this_00;
        if ((qualified_name.field_2._M_local_buf[0xe] & 1U) == 0) {
          SymbolTable<flatbuffers::StructDef>::Add(&this->structs_,name,(StructDef *)this_00);
          std::__cxx11::string::operator=((string *)local_50,(string *)name);
          *(Namespace **)&(local_50->structs_).dict._M_t._M_impl = this->current_namespace_;
          pSVar1 = &local_50->enums_;
          __return_storage_ptr__ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               operator_new(0x20);
          std::operator+(&local_80,&this->file_being_parsed_,":");
          NumToString<int>(&local_a0,(this->super_ParserState).line_);
          std::operator+(__return_storage_ptr__,&local_80,&local_a0);
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::reset((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&(pSVar1->vec).
                      super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish,__return_storage_ptr__);
          std::__cxx11::string::~string((string *)&local_a0);
          std::__cxx11::string::~string((string *)&local_80);
        }
        else {
          SymbolTable<flatbuffers::StructDef>::Add
                    (&this->structs_,(string *)&struct_def,(StructDef *)this_00);
          std::__cxx11::string::operator=((string *)local_50,(string *)name);
          *(Namespace **)&(local_50->structs_).dict._M_t._M_impl = this->current_namespace_;
        }
      }
      this_local = local_50;
    }
    else {
      this_local = local_50;
      if ((qualified_name.field_2._M_local_buf[0xe] & 1U) != 0) {
        *(Namespace **)&(local_50->structs_).dict._M_t._M_impl = this->current_namespace_;
      }
    }
  }
  else {
    if ((qualified_name.field_2._M_local_buf[0xe] & 1U) != 0) {
      *(Namespace **)&(local_50->structs_).dict._M_t._M_impl = this->current_namespace_;
      SymbolTable<flatbuffers::StructDef>::Move(&this->structs_,name,(string *)&struct_def);
    }
    this_local = local_50;
  }
  local_60 = 1;
  local_50 = this_local;
  std::__cxx11::string::~string((string *)&struct_def);
  return (StructDef *)this_local;
}

Assistant:

StructDef *Parser::LookupCreateStruct(const std::string &name,
                                      bool create_if_new, bool definition) {
  std::string qualified_name = current_namespace_->GetFullyQualifiedName(name);
  // See if it exists pre-declared by an unqualified use.
  auto struct_def = LookupStruct(name);
  if (struct_def && struct_def->predecl) {
    if (definition) {
      // Make sure it has the current namespace, and is registered under its
      // qualified name.
      struct_def->defined_namespace = current_namespace_;
      structs_.Move(name, qualified_name);
    }
    return struct_def;
  }
  // See if it exists pre-declared by an qualified use.
  struct_def = LookupStruct(qualified_name);
  if (struct_def && struct_def->predecl) {
    if (definition) {
      // Make sure it has the current namespace.
      struct_def->defined_namespace = current_namespace_;
    }
    return struct_def;
  }
  if (!definition && !struct_def) {
    struct_def = LookupStructThruParentNamespaces(name);
  }
  if (!struct_def && create_if_new) {
    struct_def = new StructDef();
    if (definition) {
      structs_.Add(qualified_name, struct_def);
      struct_def->name = name;
      struct_def->defined_namespace = current_namespace_;
    } else {
      // Not a definition.
      // Rather than failing, we create a "pre declared" StructDef, due to
      // circular references, and check for errors at the end of parsing.
      // It is defined in the current namespace, as the best guess what the
      // final namespace will be.
      structs_.Add(name, struct_def);
      struct_def->name = name;
      struct_def->defined_namespace = current_namespace_;
      struct_def->original_location.reset(
          new std::string(file_being_parsed_ + ":" + NumToString(line_)));
    }
  }
  return struct_def;
}